

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

int64_t __thiscall
icu_63::CollationIterator::previousCE
          (CollationIterator *this,UVector32 *offsets,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  CollationData *local_40;
  CollationData *d;
  uint32_t ce32;
  UChar32 c;
  int32_t limitOffset;
  UErrorCode *errorCode_local;
  UVector32 *offsets_local;
  CollationIterator *this_local;
  
  if ((this->ceBuffer).length < 1) {
    UVector32::removeAllElements(offsets);
    iVar4 = (*(this->super_UObject)._vptr_UObject[5])();
    iVar2 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (iVar2 < 0) {
      this_local = (CollationIterator *)0x101000100;
    }
    else {
      UVar1 = CollationData::isUnsafeBackward(this->data,iVar2,this->isNumeric);
      if (UVar1 == '\0') {
        d._4_4_ = CollationData::getCE32(this->data,iVar2);
        if (d._4_4_ == 0xc0) {
          local_40 = this->data->base;
          d._4_4_ = CollationData::getCE32(local_40,iVar2);
        }
        else {
          local_40 = this->data;
        }
        UVar1 = Collation::isSimpleOrLongCE32(d._4_4_);
        if (UVar1 == '\0') {
          appendCEsFromCE32(this,local_40,iVar2,d._4_4_,'\0',errorCode);
          UVar1 = ::U_SUCCESS(*errorCode);
          if (UVar1 == '\0') {
            this_local = (CollationIterator *)0x1;
          }
          else {
            if (1 < (this->ceBuffer).length) {
              iVar2 = (*(this->super_UObject)._vptr_UObject[5])();
              UVector32::addElement(offsets,iVar2,errorCode);
              while (iVar3 = UVector32::size(offsets), iVar3 <= (this->ceBuffer).length) {
                UVector32::addElement(offsets,iVar4,errorCode);
              }
            }
            iVar4 = (this->ceBuffer).length + -1;
            (this->ceBuffer).length = iVar4;
            this_local = (CollationIterator *)CEBuffer::get(&this->ceBuffer,iVar4);
          }
        }
        else {
          this_local = (CollationIterator *)Collation::ceFromCE32(d._4_4_);
        }
      }
      else {
        this_local = (CollationIterator *)previousCEUnsafe(this,iVar2,offsets,errorCode);
      }
    }
  }
  else {
    iVar4 = (this->ceBuffer).length + -1;
    (this->ceBuffer).length = iVar4;
    this_local = (CollationIterator *)CEBuffer::get(&this->ceBuffer,iVar4);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
CollationIterator::previousCE(UVector32 &offsets, UErrorCode &errorCode) {
    if(ceBuffer.length > 0) {
        // Return the previous buffered CE.
        return ceBuffer.get(--ceBuffer.length);
    }
    offsets.removeAllElements();
    int32_t limitOffset = getOffset();
    UChar32 c = previousCodePoint(errorCode);
    if(c < 0) { return Collation::NO_CE; }
    if(data->isUnsafeBackward(c, isNumeric)) {
        return previousCEUnsafe(c, offsets, errorCode);
    }
    // Simple, safe-backwards iteration:
    // Get a CE going backwards, handle prefixes but no contractions.
    uint32_t ce32 = data->getCE32(c);
    const CollationData *d;
    if(ce32 == Collation::FALLBACK_CE32) {
        d = data->base;
        ce32 = d->getCE32(c);
    } else {
        d = data;
    }
    if(Collation::isSimpleOrLongCE32(ce32)) {
        return Collation::ceFromCE32(ce32);
    }
    appendCEsFromCE32(d, c, ce32, FALSE, errorCode);
    if(U_SUCCESS(errorCode)) {
        if(ceBuffer.length > 1) {
            offsets.addElement(getOffset(), errorCode);
            // For an expansion, the offset of each non-initial CE is the limit offset,
            // consistent with forward iteration.
            while(offsets.size() <= ceBuffer.length) {
                offsets.addElement(limitOffset, errorCode);
            };
        }
        return ceBuffer.get(--ceBuffer.length);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}